

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::RawHashSamplerTest_DoNotSampleCustomAllocators_Test::TestBody
          (RawHashSamplerTest_DoNotSampleCustomAllocators_Test *this)

{
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
  *this_00;
  uint uVar1;
  char cVar2;
  pointer __p;
  pointer pCVar3;
  pointer __result;
  pointer pCVar4;
  pointer __last;
  size_t i;
  _Tp_alloc_type *__alloc;
  size_t __n;
  pointer __first;
  _Manager_type p_Var5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  AssertHelper in_stack_ffffffffffffff88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff90;
  AssertionResult gtest_ar;
  _Manager_type local_58;
  undefined8 local_40;
  undefined8 local_38;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar._0_8_ = &local_40;
  local_58 = std::
             _Function_handler<void_(const_phmap::priv::HashtablezInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc:1889:33)>
             ::_M_manager;
  local_40 = 0;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  pCVar4 = (pointer)0x0;
  __last = (pointer)0x0;
  iVar9 = 0;
  __first = (pointer)0x0;
  do {
    if (iVar9 == 1000000) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar._0_8_ = &local_38;
      local_38 = 0;
      std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
      testing::internal::DoubleNearPredFormat
                ((char *)__last,(char *)__first,(char *)pCVar4,(double)gtest_ar._0_8_,
                 (double)in_stack_ffffffffffffff90._M_head_impl,
                 (double)in_stack_ffffffffffffff88.data_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&stack0xffffffffffffff90);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                   ,0x76c,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff88,(Message *)&stack0xffffffffffffff90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88);
        if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )in_stack_ffffffffffffff90._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffff90._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      std::
      vector<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
      ::~vector((vector<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
                 *)&stack0xffffffffffffff68);
      return;
    }
    if (__last == pCVar4) {
      if ((long)pCVar4 - (long)__first == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      __p = (pointer)(((long)pCVar4 - (long)__first) / 0x30);
      pCVar3 = __p;
      if (pCVar4 == __first) {
        pCVar3 = (pointer)0x1;
      }
      uVar8 = (long)&(pCVar3->
                     super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                     ).ctrl_ +
              (long)&(__p->
                     super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                     ).ctrl_;
      __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
      if (0x2aaaaaaaaaaaaa9 < uVar8) {
        uVar8 = 0x2aaaaaaaaaaaaaa;
      }
      if (CARRY8((ulong)pCVar3,(ulong)__p)) {
        uVar8 = 0x2aaaaaaaaaaaaaa;
      }
      if (uVar8 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar8 * 0x30);
      }
      *(undefined1 (*) [16])
       &__result[(long)__p].
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
        .field_0x20 = (undefined1  [16])0x0;
      __result[(long)__p].
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      .size_ = 0;
      __result[(long)__p].
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      .capacity_ = 0;
      __result[(long)__p].
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      .ctrl_ = (ctrl_t *)0x0;
      __result[(long)__p].
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      .slots_ = (slot_type *)0x0;
      pCVar4 = std::
               vector<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
               ::_S_relocate(__first,__last,__result,__alloc);
      __last = std::
               vector<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
               ::_S_relocate(__last,__last,pCVar4 + 1,__alloc);
      std::
      _Vector_base<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
      ::_M_deallocate((_Vector_base<phmap::priv::(anonymous_namespace)::CustomAllocIntTable,_std::allocator<phmap::priv::(anonymous_namespace)::CustomAllocIntTable>_>
                       *)__first,__p,__n);
      pCVar4 = __result + uVar8;
    }
    else {
      *(undefined1 (*) [16])
       &(__last->
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
        ).field_0x20 = (undefined1  [16])0x0;
      (__last->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      ).size_ = 0;
      (__last->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      ).capacity_ = 0;
      (__last->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      ).ctrl_ = (ctrl_t *)0x0;
      (__last->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      ).slots_ = (slot_type *)0x0;
      __last = __last + 1;
      __result = __first;
    }
    this_00 = &__last[-1].
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
    ;
    if (__last[-1].
        super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
        .ctrl_ != (ctrl_t *)0x0) {
      raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
      ::probe((probe_seq<16UL> *)&gtest_ar,this_00,0xde5fb9d2630458e9);
      while( true ) {
        pcVar6 = __last[-1].
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
                 .ctrl_ + (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
        cVar2 = pcVar6[0xf];
        auVar11[0] = -(*pcVar6 == 'i');
        auVar11[1] = -(pcVar6[1] == 'i');
        auVar11[2] = -(pcVar6[2] == 'i');
        auVar11[3] = -(pcVar6[3] == 'i');
        auVar11[4] = -(pcVar6[4] == 'i');
        auVar11[5] = -(pcVar6[5] == 'i');
        auVar11[6] = -(pcVar6[6] == 'i');
        auVar11[7] = -(pcVar6[7] == 'i');
        auVar11[8] = -(pcVar6[8] == 'i');
        auVar11[9] = -(pcVar6[9] == 'i');
        auVar11[10] = -(pcVar6[10] == 'i');
        auVar11[0xb] = -(pcVar6[0xb] == 'i');
        auVar11[0xc] = -(pcVar6[0xc] == 'i');
        auVar11[0xd] = -(pcVar6[0xd] == 'i');
        auVar11[0xe] = -(pcVar6[0xe] == 'i');
        auVar11[0xf] = -(cVar2 == 'i');
        for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(auVar11[0xf] >> 7) << 0xf); uVar7 != 0;
            uVar7 = uVar7 - 1 & uVar7) {
          uVar1 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
            }
          }
          uVar8 = (ulong)uVar1 +
                  (long)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl & gtest_ar._0_8_;
          if (__last[-1].
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
              .slots_[uVar8] == 1) {
            if (uVar8 == 0xffffffffffffffff) goto LAB_00135f8c;
            goto LAB_00135fb1;
          }
        }
        auVar10[0] = -(*pcVar6 == -0x80);
        auVar10[1] = -(pcVar6[1] == -0x80);
        auVar10[2] = -(pcVar6[2] == -0x80);
        auVar10[3] = -(pcVar6[3] == -0x80);
        auVar10[4] = -(pcVar6[4] == -0x80);
        auVar10[5] = -(pcVar6[5] == -0x80);
        auVar10[6] = -(pcVar6[6] == -0x80);
        auVar10[7] = -(pcVar6[7] == -0x80);
        auVar10[8] = -(pcVar6[8] == -0x80);
        auVar10[9] = -(pcVar6[9] == -0x80);
        auVar10[10] = -(pcVar6[10] == -0x80);
        auVar10[0xb] = -(pcVar6[0xb] == -0x80);
        auVar10[0xc] = -(pcVar6[0xc] == -0x80);
        auVar10[0xd] = -(pcVar6[0xd] == -0x80);
        auVar10[0xe] = -(pcVar6[0xe] == -0x80);
        auVar10[0xf] = -(cVar2 == -0x80);
        if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar2 == -0x80)
        break;
        p_Var5 = local_58 +
                 (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10;
        local_58 = local_58 + 0x10;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )((ulong)p_Var5 & gtest_ar._0_8_);
      }
    }
LAB_00135f8c:
    i = raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
        ::prepare_insert(this_00,0xde5fb9d2630458e9);
    __last[-1].
    super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
    .slots_[i] = 1;
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
    ::set_ctrl(this_00,i,'i');
LAB_00135fb1:
    iVar9 = iVar9 + 1;
    __first = __result;
  } while( true );
}

Assistant:

TEST(RawHashSamplerTest, DoNotSampleCustomAllocators) {
  // Enable the feature even if the prod default is off.
  SetHashtablezEnabled(true);
  SetHashtablezSampleParameter(100);

   auto& sampler = HashtablezSampler::Global();
  size_t start_size = 0;
  start_size += sampler.Iterate([&](const HashtablezInfo&) { ++start_size; });

   std::vector<CustomAllocIntTable> tables;
  for (int i = 0; i < 1000000; ++i) {
    tables.emplace_back();
    tables.back().insert(1);
  }
  size_t end_size = 0;
  end_size += sampler.Iterate([&](const HashtablezInfo&) { ++end_size; });

   EXPECT_NEAR((end_size - start_size) / static_cast<double>(tables.size()),
              0.00, 0.001);
}